

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_lantern_handling.hpp
# Opt level: O1

uint32_t PatchImproveLanternHandling::inject_func_dim_palettes(ROM *rom,uint32_t func_and_words)

{
  uint32_t uVar1;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<md::DataRegister> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  Code func;
  allocator_type local_112;
  allocator_type local_111;
  string local_110;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_f0;
  AddressRegister local_d8;
  DataRegister local_c8;
  AddressRegister local_b8;
  Code local_a8;
  
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.super_Register._code = '\x01';
  local_c8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  __l._M_len = 1;
  __l._M_array = &local_c8;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_110,__l,
             &local_111);
  local_d8.super_Register._code = '\0';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  __l_00._M_len = 1;
  __l_00._M_array = &local_d8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_f0,__l_00,&local_112);
  local_b8.super_Register._code = '\a';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  md::Code::movem(&local_a8,
                  (vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_110,
                  &local_f0,true,&local_b8,LONG);
  if (local_f0.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_110._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_110._M_dataplus._M_p,
                    local_110.field_2._M_allocated_capacity - (long)local_110._M_dataplus._M_p);
  }
  local_f0.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f0.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_110._M_dataplus._M_p = (pointer)&PTR_getXn_00261c98;
  local_110._M_string_length = 0x100000ccc;
  md::Code::move(&local_a8,(Param *)&local_110,(Param *)&local_f0,WORD);
  local_f0.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f0.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261c50;
  local_110._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_110._M_string_length = 0x200ff0080;
  md::Code::lea(&local_a8,(Param *)&local_110,(AddressRegister *)&local_f0);
  local_f0.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 1;
  local_f0.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_110._M_dataplus._M_p = (pointer)&PTR_getXn_00261c98;
  local_110._M_string_length = 0x100000010;
  md::Code::move(&local_a8,(Param *)&local_110,(Param *)&local_f0,WORD);
  local_110._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_110._M_string_length = CONCAT44(2,func_and_words);
  md::Code::jsr(&local_a8,(Param *)&local_110);
  local_c8.super_Register._code = '\x01';
  local_c8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  __l_01._M_len = 1;
  __l_01._M_array = &local_c8;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_110,__l_01,
             &local_111);
  local_d8.super_Register._code = '\0';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  __l_02._M_len = 1;
  __l_02._M_array = &local_d8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_f0,__l_02,&local_112);
  local_b8.super_Register._code = '\a';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  md::Code::movem(&local_a8,
                  (vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_110,
                  &local_f0,false,&local_b8,LONG);
  if (local_f0.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((undefined **)local_110._M_dataplus._M_p != (undefined **)0x0) {
    operator_delete(local_110._M_dataplus._M_p,
                    local_110.field_2._M_allocated_capacity - (long)local_110._M_dataplus._M_p);
  }
  md::Code::rts(&local_a8);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  uVar1 = md::ROM::inject_code(rom,&local_a8,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_a8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8._pending_branches._M_t);
  if (local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

static uint32_t inject_func_dim_palettes(md::ROM& rom, uint32_t func_and_words)
    {
        // Darken palettes with AND filter contained in D0
        md::Code func;
        func.movem_to_stack({ reg_D1 }, { reg_A0 });
        {
            // Slightly dim palette 0
            func.movew(0x0CCC, reg_D0);
            func.lea(0xFF0080, reg_A0);
            func.movew(16, reg_D1);
            func.jsr(func_and_words);
        }
        func.movem_from_stack({ reg_D1 }, { reg_A0 });
        func.rts();
        return rom.inject_code(func);
    }